

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataView.cpp
# Opt level: O0

Var Js::DataView::NewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags e;
  BOOL BVar3;
  uint uVar4;
  ScriptContext *pSVar5;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar6;
  Var pvVar7;
  ArrayBufferBase *this_00;
  JavascriptLibrary *this_01;
  RecyclableObject *constructor;
  DataView *local_b8;
  uint32 viewRange;
  Var thirdArgument;
  Var secondArgument;
  DataView *dataView;
  ArrayBufferBase *arrayBuffer;
  uint32 local_70;
  int32 offset;
  uint32 mappedLength;
  uint32 byteLength;
  byte local_51;
  Var pvStack_50;
  bool isCtorSuperCall;
  Var newTarget;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar5 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar5);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar5,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DataView.cpp"
                                ,0x10,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  newTarget = RecyclableObject::GetScriptContext(function);
  if (((ulong)scriptContext & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DataView.cpp"
                                ,0x13,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pvStack_50 = Arguments::GetNewTarget((Arguments *)&scriptContext);
  Arguments::Arguments((Arguments *)&mappedLength,(Arguments *)&scriptContext);
  local_51 = Js::JavascriptOperators::GetAndAssertIsConstructorSuperCall((Arguments *)&mappedLength)
  ;
  arrayBuffer._4_4_ = 0;
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if ((bVar2) ||
     ((pvStack_50 != (Var)0x0 &&
      (BVar3 = Js::JavascriptOperators::IsUndefinedObject(pvStack_50), BVar3 != 0)))) {
    JavascriptError::ThrowTypeError((ScriptContext *)newTarget,-0x7ff5ea00,L"DataView");
  }
  if (((uint)scriptContext & 0xffffff) < 2) {
    JavascriptError::ThrowTypeError((ScriptContext *)newTarget,-0x7ff5ec20,L"buffer");
  }
  pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,1);
  bVar2 = VarIs<Js::ArrayBufferBase>(pvVar7);
  if (!bVar2) {
    JavascriptError::ThrowTypeError((ScriptContext *)newTarget,-0x7ff5ea1c,L"buffer");
  }
  pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,1);
  this_00 = VarTo<Js::ArrayBufferBase>(pvVar7);
  if (2 < ((uint)scriptContext & 0xffffff)) {
    pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,2);
    arrayBuffer._4_4_ =
         ArrayBuffer::ToIndex(pvVar7,-0x7ff5ec5b,(ScriptContext *)newTarget,0x7fffffff,false);
  }
  bVar2 = ArrayBufferBase::IsDetached(this_00);
  if (bVar2) {
    JavascriptError::ThrowTypeError((ScriptContext *)newTarget,-0x7ff5ebe5,(PCWSTR)0x0);
  }
  uVar4 = (*(this_00->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])();
  if (uVar4 < arrayBuffer._4_4_) {
    JavascriptError::ThrowRangeError((ScriptContext *)newTarget,-0x7ff5ec1e,L"byteOffset");
  }
  if (3 < ((uint)scriptContext & 0xffffff)) {
    pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,3);
    BVar3 = Js::JavascriptOperators::IsUndefinedObject(pvVar7);
    if (BVar3 == 0) {
      pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,3);
      local_70 = ArrayBuffer::ToIndex
                           (pvVar7,-0x7ff5ec5b,(ScriptContext *)newTarget,0x7fffffff,false);
      if ((uVar4 < local_70 + arrayBuffer._4_4_) || (local_70 + arrayBuffer._4_4_ < local_70)) {
        JavascriptError::ThrowRangeError((ScriptContext *)newTarget,-0x7ff5ec1e,L"byteLength");
      }
      goto LAB_0106af4c;
    }
  }
  local_70 = uVar4 - arrayBuffer._4_4_;
LAB_0106af4c:
  bVar2 = ArrayBufferBase::IsDetached(this_00);
  if (!bVar2) {
    this_01 = ScriptContext::GetLibrary((ScriptContext *)newTarget);
    local_b8 = JavascriptLibrary::CreateDataView(this_01,this_00,arrayBuffer._4_4_,local_70);
    if ((local_51 & 1) != 0) {
      constructor = VarTo<Js::RecyclableObject>(pvStack_50);
      local_b8 = (DataView *)
                 Js::JavascriptOperators::OrdinaryCreateFromConstructor
                           (constructor,(RecyclableObject *)local_b8,(DynamicObject *)0x0,
                            (ScriptContext *)newTarget);
    }
    return local_b8;
  }
  JavascriptError::ThrowTypeError((ScriptContext *)newTarget,-0x7ff5ebe5,(PCWSTR)0x0);
}

Assistant:

Var DataView::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");

        Var newTarget = args.GetNewTarget();
        bool isCtorSuperCall = JavascriptOperators::GetAndAssertIsConstructorSuperCall(args);
        uint32 byteLength = 0;
        uint32 mappedLength;
        int32 offset = 0;
        ArrayBufferBase* arrayBuffer = nullptr;
        DataView* dataView;

        //1.    If NewTarget is undefined, throw a TypeError exception.
        if (!(callInfo.Flags & CallFlags_New) || (newTarget && JavascriptOperators::IsUndefinedObject(newTarget)))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_ClassConstructorCannotBeCalledWithoutNew, _u("DataView"));
        }

        if (args.Info.Count < 2)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_DataView_NeedArgument, _u("buffer"));
        }

        //2.    If Type(buffer) is not Object, throw a TypeError exception.
        //3.    If buffer does not have an [[ArrayBufferData]] internal slot, throw a TypeError exception.
        if (arrayBuffer == nullptr)
        {
            if (VarIs<ArrayBufferBase>(args[1]))
            {
                arrayBuffer = VarTo<ArrayBufferBase>(args[1]);
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedArrayBufferObject, _u("buffer"));
            }
        }

        //4.    Let offset be ToIndex(byteOffset).
        if (args.Info.Count > 2)
        {
            Var secondArgument = args[2];
            offset = ArrayBuffer::ToIndex(secondArgument, JSERR_ArrayLengthConstructIncorrect, scriptContext, ArrayBuffer::MaxArrayBufferLength, false);
        }

        //5.    If IsDetachedBuffer(buffer) is true, throw a TypeError exception.
        if (arrayBuffer->IsDetached())
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray);
        }

        //6.    Let bufferByteLength be the value of buffer's[[ArrayBufferByteLength]] internal slot.
        //7.   If offset > bufferByteLength, throw a RangeError exception.
        byteLength = arrayBuffer->GetByteLength();
        if ((uint32)offset > byteLength)
        {
            JavascriptError::ThrowRangeError(
                scriptContext, JSERR_DataView_InvalidArgument, _u("byteOffset"));
        }

        //8.   If byteLength is either not present or is undefined, then
        //      a.  Let viewByteLength be bufferByteLength - offset.
        //9.   Else,
        //      a.  Let viewByteLength be ToIndex(byteLength).
        //      b.  If offset + viewByteLength > bufferByteLength, throw a RangeError exception.
        if (args.Info.Count > 3 && !JavascriptOperators::IsUndefinedObject(args[3]))
        {
            Var thirdArgument = args[3];
            mappedLength = ArrayBuffer::ToIndex(thirdArgument, JSERR_ArrayLengthConstructIncorrect, scriptContext, ArrayBuffer::MaxArrayBufferLength, false);
            uint32 viewRange = mappedLength + offset;

            if (viewRange > byteLength || viewRange < mappedLength) // overflow indicates out-of-range
            {
                JavascriptError::ThrowRangeError(
                    scriptContext, JSERR_DataView_InvalidArgument, _u("byteLength"));
            }
        }
        else
        {
            mappedLength = byteLength - offset;
        }

        // Evaluation of the argument(s) above is reentrant and can detach the array.
        if (arrayBuffer->IsDetached())
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray);
        }

        //10.   Let O be OrdinaryCreateFromConstructor(NewTarget, "%DataViewPrototype%", [[DataView]], [[ViewedArrayBuffer]], [[ByteLength]], [[ByteOffset]]).
        //11.   Set O's[[DataView]] internal slot to true.
        //12.   Set O's[[ViewedArrayBuffer]] internal slot to buffer.
        //13.   Set O's[[ByteLength]] internal slot to viewByteLength.
        //14.   Set O's[[ByteOffset]] internal slot to offset.
        //15.   Return O.
        dataView = scriptContext->GetLibrary()->CreateDataView(arrayBuffer, offset, mappedLength);
        return isCtorSuperCall ?
            JavascriptOperators::OrdinaryCreateFromConstructor(VarTo<RecyclableObject>(newTarget), dataView, nullptr, scriptContext) :
            dataView;
    }